

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Intrinsics.cpp
# Opt level: O3

Value * __thiscall
soul::CompileTimeIntrinsicEvaluation::perform<double,double>
          (Value *__return_storage_ptr__,CompileTimeIntrinsicEvaluation *this,
          ArrayView<soul::Value> args,_func_double_double_double *fn)

{
  Value *extraout_RAX;
  double dVar1;
  double dVar2;
  PackedData local_38;
  
  if ((long)args.s - (long)this == 0x80) {
    soul::Value::getData(&local_38,(Value *)this);
    dVar1 = soul::Value::PackedData::getAsDouble(&local_38);
    soul::Value::getData(&local_38,(Value *)(this + 0x40));
    dVar2 = soul::Value::PackedData::getAsDouble(&local_38);
    dVar1 = (double)(*(code *)args.e)(dVar1,SUB84(dVar2,0));
    soul::Value::Value(__return_storage_ptr__,dVar1);
    return extraout_RAX;
  }
  throwInternalCompilerError("args.size() == 2","perform",0x28);
}

Assistant:

IntrinsicType getIntrinsicTypeFromName (std::string_view s)
{
    #define SOUL_MATCH_INTRINSIC(i)  if (s == #i) return IntrinsicType::i;
    SOUL_INTRINSICS (SOUL_MATCH_INTRINSIC)
    #undef SOUL_MATCH_INTRINSIC

    return IntrinsicType::none;
}